

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Action<void_(const_std::function<void_()>_&)> * __thiscall
testing::internal::TypedExpectation<void_(const_std::function<void_()>_&)>::GetCurrentAction
          (TypedExpectation<void_(const_std::function<void_()>_&)> *this,
          FunctionMocker<void_(const_std::function<void_()>_&)> *mocker,ArgumentTuple *args)

{
  code *pcVar1;
  int iVar2;
  ostream *poVar3;
  TypedExpectation<void_(const_std::function<void_()>_&)> *pTVar4;
  char *pcVar5;
  int iVar6;
  string sStack_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  iVar2 = ExpectationBase::call_count((ExpectationBase *)this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,
             "call_count() is <= 0 when GetCurrentAction() is called - this should never happen.",
             (allocator<char> *)&sStack_1d8);
  Assert(0 < iVar2,
         "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/googletest-src/googlemock/include/gmock/gmock-spec-builders.h"
         ,0x494,(string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  iVar6 = (int)((ulong)(*(long *)(this + 0x90) - *(long *)(this + 0x88)) >> 3);
  if (((0 < iVar6) && (iVar6 < iVar2)) &&
     (this[0xa1] == (TypedExpectation<void_(const_std::function<void_()>_&)>)0x0)) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    ExpectationBase::DescribeLocationTo((ExpectationBase *)this,local_1a8);
    poVar3 = std::operator<<(local_1a8,"Actions ran out in ");
    poVar3 = std::operator<<(poVar3,*(char **)(this + 0x18));
    poVar3 = std::operator<<(poVar3,"...\n");
    poVar3 = std::operator<<(poVar3,"Called ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3," times, but only ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar6);
    poVar3 = std::operator<<(poVar3," WillOnce()");
    pcVar5 = "s are";
    if (iVar6 == 1) {
      pcVar5 = " is";
    }
    poVar3 = std::operator<<(poVar3,pcVar5);
    std::operator<<(poVar3," specified - ");
    FunctionMocker<void_(const_std::function<void_()>_&)>::DescribeDefaultActionTo
              (mocker,args,local_1a8);
    std::__cxx11::stringbuf::str();
    Log(kWarning,&sStack_1d8,1);
    std::__cxx11::string::~string((string *)&sStack_1d8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  if (iVar6 < iVar2) {
    pTVar4 = this + 0x120;
  }
  else {
    if (SBORROW4(iVar2,1)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    pTVar4 = *(TypedExpectation<void_(const_std::function<void_()>_&)> **)
              (*(long *)(this + 0x88) + (long)(iVar2 + -1) * 8);
  }
  return (Action<void_(const_std::function<void_()>_&)> *)pTVar4;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    const int count = call_count();
    Assert(count >= 1, __FILE__, __LINE__,
           "call_count() is <= 0 when GetCurrentAction() is "
           "called - this should never happen.");

    const int action_count = static_cast<int>(untyped_actions_.size());
    if (action_count > 0 && !repeated_action_specified_ &&
        count > action_count) {
      // If there is at least one WillOnce() and no WillRepeatedly(),
      // we warn the user when the WillOnce() clauses ran out.
      ::std::stringstream ss;
      DescribeLocationTo(&ss);
      ss << "Actions ran out in " << source_text() << "...\n"
         << "Called " << count << " times, but only "
         << action_count << " WillOnce()"
         << (action_count == 1 ? " is" : "s are") << " specified - ";
      mocker->DescribeDefaultActionTo(args, &ss);
      Log(kWarning, ss.str(), 1);
    }

    return count <= action_count
               ? *static_cast<const Action<F>*>(
                     untyped_actions_[static_cast<size_t>(count - 1)])
               : repeated_action();
  }